

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setCurrencyPluralInfo(DecimalFormat *this,CurrencyPluralInfo *info)

{
  DecimalFormatProperties *pDVar1;
  CurrencyPluralInfo *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  pCVar2 = (pDVar1->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr;
  if (pCVar2 == (CurrencyPluralInfo *)0x0) {
    iVar3 = CurrencyPluralInfo::clone(info,(__fn *)info,in_RDX,in_ECX,in_R8);
    pCVar2 = (pDVar1->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.
             ptr;
    if (pCVar2 != (CurrencyPluralInfo *)0x0) {
      (*(pCVar2->super_UObject)._vptr_UObject[1])();
    }
    (pDVar1->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr =
         (CurrencyPluralInfo *)CONCAT44(extraout_var,iVar3);
  }
  else {
    CurrencyPluralInfo::operator=(pCVar2,info);
  }
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setCurrencyPluralInfo(const CurrencyPluralInfo& info) {
    if (fields->properties->currencyPluralInfo.fPtr.isNull()) {
        fields->properties->currencyPluralInfo.fPtr.adoptInstead(info.clone());
    } else {
        *fields->properties->currencyPluralInfo.fPtr = info; // copy-assignment operator
    }
    touchNoError();
}